

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetHeaderSources
          (cmGeneratorTarget *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *data,string *config)

{
  KindedSources *pKVar1;
  pointer __x;
  
  pKVar1 = GetKindedSources(this,config);
  for (__x = (pKVar1->Sources).
             super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
             ._M_impl.super__Vector_impl_data._M_start;
      __x != (pKVar1->Sources).
             super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
             ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
    if (__x->Kind == SourceKindHeader) {
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::push_back
                (data,&__x->Source);
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetHeaderSources(
  std::vector<cmSourceFile const*>& data, const std::string& config) const
{
  IMPLEMENT_VISIT(SourceKindHeader);
}